

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::record::IntegerBase<5U,_9U>::verifySize(uint size)

{
  undefined8 *puVar1;
  
  if (size < 10) {
    return;
  }
  tools::Log::error<char_const*,unsigned_int>
            ("Too many K values for INTG record with NDIGIT = {}",5);
  tools::Log::info<char_const*,unsigned_int>("Expected at most: {}",9);
  tools::Log::info<char_const*,unsigned_int>("Got: {}",size);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( unsigned int size ) {

  if ( size > N ) {

    Log::error( "Too many K values for INTG record with NDIGIT = {}", NDIGIT );
    Log::info( "Expected at most: {}", N );
    Log::info( "Got: {}", size );
    throw std::exception();
  }
}